

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

shared_ptr<pbrt::Material> __thiscall
pbrt::BinaryReader::getEntity<pbrt::Material>(BinaryReader *this,int ID)

{
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined4 in_register_00000034;
  shared_ptr<pbrt::Material> sVar1;
  
  if (((int)in_RDX._M_pi == -1) ||
     (*(long *)(*(long *)(CONCAT44(in_register_00000034,ID) + 0x20) + (long)(int)in_RDX._M_pi * 0x10
               ) == 0)) {
    (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    sVar1 = std::dynamic_pointer_cast<pbrt::Material,pbrt::Entity>((shared_ptr<pbrt::Entity> *)this)
    ;
    in_RDX = sVar1.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((this->currentEntityData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"error in reading binary file - given entity is not of expected type!");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  sVar1.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar1.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<pbrt::Material>)
         sVar1.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getEntity(int ID)
    {
      // rule 1: ID -1 is a valid identifier for 'null object'
      if (ID == -1)
        return std::shared_ptr<T>();
      // assertion: only values with ID 0 ... N-1 are allowed
      assert(ID < (int)readEntities.size() && ID >= 0);

      // rule 2: if object _was_ a null pointer, return it (that was
      // an error during object creation)
      if (!readEntities[ID])
        return std::shared_ptr<T>();

      std::shared_ptr<T> t = std::dynamic_pointer_cast<T>(readEntities[ID]);
      
      // rule 3: if object was of different type, throw an exception
      if (!t)
        throw std::runtime_error("error in reading binary file - given entity is not of expected type!");

      // rule 4: otherwise, return object cast to that type
      return t;
    }